

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::DumpFunctionPositionCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsValueRef pvStack_40;
  JsErrorCode jsErrorCode;
  JsValueRef functionPosition;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  pvStack_40 = (JsValueRef)0x0;
  if (1 < argumentCount) {
    functionPosition = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    JVar1 = ChakraRTInterface::JsDiagGetFunctionPosition(arguments[1],&stack0xffffffffffffffc0);
    if ((JVar1 == JsNoError) ||
       (JVar1 = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffc0), JVar1 == JsNoError
       )) {
      if (Debugger::debugger != (Debugger *)0x0) {
        Debugger::DumpFunctionPosition(Debugger::debugger,pvStack_40);
      }
    }
    else {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&functionPosition) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
    }
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef WScriptJsrt::DumpFunctionPositionCallback(JsValueRef callee, bool isConstructCall, JsValueRef * arguments, unsigned short argumentCount, void * callbackState)
{
    JsValueRef functionPosition = JS_INVALID_REFERENCE;

    if (argumentCount > 1)
    {
        if (ChakraRTInterface::JsDiagGetFunctionPosition(arguments[1], &functionPosition) != JsNoError)
        {
            // If we can't get the functionPosition pass undefined
            IfJsErrorFailLogAndRet(ChakraRTInterface::JsGetUndefinedValue(&functionPosition));
        }

        if (Debugger::debugger != nullptr)
        {
            Debugger::debugger->DumpFunctionPosition(functionPosition);
        }
    }

    return JS_INVALID_REFERENCE;
}